

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::String::padEnd(String *this,size_t n,char c)

{
  String *in_RSI;
  byte *in_RDI;
  size_t size;
  Error local_64;
  String *local_60;
  
  if (*in_RDI < 0x1f) {
    local_60 = (String *)(ulong)*in_RDI;
  }
  else {
    local_60 = *(String **)(in_RDI + 8);
  }
  if (local_60 < in_RSI) {
    local_64 = _opChars(local_60,(ModifyOp)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18),
                        (size_t)in_RDI);
  }
  else {
    local_64 = 0;
  }
  return local_64;
}

Assistant:

Error String::padEnd(size_t n, char c) noexcept {
  size_t size = this->size();
  return n > size ? appendChars(c, n - size) : kErrorOk;
}